

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_builder.cpp
# Opt level: O1

bool __thiscall Clasp::SatBuilder::doEndProgram(SatBuilder *this)

{
  byte bVar1;
  byte bVar2;
  uint32 uVar3;
  Share SVar4;
  SharedContext *pSVar5;
  pointer pVVar6;
  bool bVar7;
  ulong uVar8;
  pointer pLVar9;
  uint v;
  pointer pLVar10;
  Result RVar11;
  Literal relax;
  LitVec cc;
  Literal local_4c;
  iterator local_48;
  ulong uStack_40;
  Fill<Clasp::Literal> local_38;
  
  bVar7 = SharedContext::ok((this->super_ProgramBuilder).ctx_);
  if ((bVar7) && ((this->softClauses_).ebo_.size != 0)) {
    SharedContext::setPreproMode((this->super_ProgramBuilder).ctx_,1,true);
    pSVar5 = (this->super_ProgramBuilder).ctx_;
    SharedContext::addVars(pSVar5,(this->vars_ - (pSVar5->varInfo_).ebo_.size) + 1,Atom,' ');
    SharedContext::startAddConstraints((this->super_ProgramBuilder).ctx_,100);
    local_48 = (iterator)0x0;
    uStack_40 = 0;
    uVar8 = (ulong)(this->softClauses_).ebo_.size;
    if (bVar7 && uVar8 != 0) {
      pLVar9 = (this->softClauses_).ebo_.buf;
      pLVar10 = pLVar9 + uVar8;
      do {
        uVar3 = pLVar9->rep_;
        local_4c.rep_ = pLVar9[1].rep_;
        if ((local_4c.rep_ & 1) == 0) {
          uStack_40 = uStack_40 & 0xffffffff00000000;
          local_38.val_ = &local_4c;
          bk_lib::pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>>::
          insert_impl<unsigned_int,bk_lib::detail::Fill<Clasp::Literal>>
                    ((pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>> *)&local_48,local_48
                     ,1,&local_38);
          do {
            bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                      ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)&local_48,
                       pLVar9 + 2);
            pLVar9 = pLVar9 + 1;
          } while ((local_48[(int)uStack_40 - 1U].rep_ & 1) == 0);
          local_48[(int)uStack_40 - 1U].rep_ = local_48[(int)uStack_40 - 1U].rep_ & 0xfffffffe;
          local_38.val_ = (Literal *)((ulong)local_38.val_ & 0xffffffff00000000);
          RVar11 = ClauseCreator::create
                             (*(((this->super_ProgramBuilder).ctx_)->solvers_).ebo_.buf,
                              (LitVec *)&local_48,0,(ConstraintInfo *)&local_38);
          bVar7 = ((undefined1  [16])RVar11 & (undefined1  [16])0x2) == (undefined1  [16])0x0;
        }
        uVar8 = CONCAT44(uVar3,local_4c.rep_);
        local_4c.rep_ = local_4c.rep_ & 0xfffffffe;
        SharedContext::addMinimize
                  ((this->super_ProgramBuilder).ctx_,(WeightLiteral)(uVar8 & 0xfffffffffffffffe),0);
        pLVar9 = pLVar9 + 2;
      } while ((pLVar9 != pLVar10) && (bVar7 != false));
    }
    pLVar9 = (this->softClauses_).ebo_.buf;
    (this->softClauses_).ebo_.buf = (pointer)0x0;
    (this->softClauses_).ebo_.size = 0;
    (this->softClauses_).ebo_.cap = 0;
    if (pLVar9 != (pointer)0x0) {
      operator_delete(pLVar9);
    }
    if (local_48 != (iterator)0x0) {
      operator_delete(local_48);
    }
  }
  if (bVar7 != false) {
    if ((this->varState_).ebo_.size != 1) {
      SVar4 = ((this->super_ProgramBuilder).ctx_)->share_;
      v = 1;
      do {
        bVar1 = (this->varState_).ebo_.buf[v];
        if ((~bVar1 & 0xc) != 0) {
          if (bVar1 == 0) {
            if (((uint)SVar4 >> 0x1b & 1) == 0) {
              SharedContext::eliminate((this->super_ProgramBuilder).ctx_,v);
            }
          }
          else {
            pSVar5 = (this->super_ProgramBuilder).ctx_;
            pVVar6 = (pSVar5->varInfo_).ebo_.buf;
            bVar2 = pVVar6[v].rep;
            if ((bVar2 & 0x20) != 0) {
              pVVar6[v].rep = bVar2 & 0xdf;
            }
            Solver::setPref(*(pSVar5->solvers_).ebo_.buf,v,def_value,bVar1 >> 2);
          }
        }
        v = v + 1;
      } while (v != (this->varState_).ebo_.size);
    }
    ProgramBuilder::markOutputVariables(&this->super_ProgramBuilder);
  }
  return bVar7;
}

Assistant:

bool SatBuilder::doEndProgram() {
	bool ok = ctx()->ok();
	if (!softClauses_.empty() && ok) {
		ctx()->setPreserveModels(true);
		uint32 softVars = vars_ - ctx()->numVars();
		ctx()->addVars(softVars, Var_t::Atom, VarInfo::Nant);
		ctx()->startAddConstraints();
		LitVec cc;
		for (LitVec::const_iterator it = softClauses_.begin(), end = softClauses_.end(); it != end && ok; ++it) {
			weight_t w     = (weight_t)it->rep();
			Literal  relax = *++it;
			if (!relax.flagged()) {
				cc.assign(1, relax);
				do { cc.push_back(*++it); } while (!cc.back().flagged());
				cc.back().unflag();
				ok = ClauseCreator::create(*ctx()->master(), cc, Constraint_t::Static).ok();
			}
			addMinLit(0, WeightLiteral(relax.unflag(), w));
		}
		LitVec().swap(softClauses_);
	}
	if (ok) {
		const uint32 seen = 12;
		const bool   elim = !ctx()->preserveModels();
		for (Var v = 1; v != (Var)varState_.size() && ok; ++v) {
			uint32 m = varState_[v];
			if ( (m & seen) != seen ) {
				if      (m)   { ctx()->setNant(v, false); ctx()->master()->setPref(v, ValueSet::def_value, ValueRep(m >> 2)); }
				else if (elim){ ctx()->eliminate(v); }
			}
		}
		markOutputVariables();
	}
	return ok;
}